

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O0

bool __thiscall ConfigFile::save(ConfigFile *this,string *path)

{
  byte bVar1;
  Stream *pSVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_259;
  string local_258 [32];
  undefined1 local_238 [32];
  ofstream file;
  string *path_local;
  ConfigFile *this_local;
  
  std::ofstream::ofstream(local_238 + 0x18,(string *)path,_S_trunc);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_258,"config",&local_259);
    Log::Logger::operator[]((Logger *)local_238,(string *)&Log::Error);
    pSVar2 = Log::Stream::operator<<((Stream *)local_238,"Failed to open config file \'");
    pSVar2 = Log::Stream::operator<<(pSVar2,path);
    Log::Stream::operator<<(pSVar2,"\'");
    Log::Stream::~Stream((Stream *)local_238);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator(&local_259);
    this_local._7_1_ = false;
  }
  else {
    sVar3 = write(this,(int)local_238 + 0x18,__buf,in_RCX);
    this_local._7_1_ = (bool)((byte)sVar3 & 1);
  }
  std::ofstream::~ofstream(local_238 + 0x18);
  return this_local._7_1_;
}

Assistant:

bool
ConfigFile::save(const std::string &path) {
  std::ofstream file(path, std::ios_base::trunc);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return write(&file);
}